

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::TexLookup::tokenize(TexLookup *this,GeneratorState *state,TokenStream *str)

{
  Type TVar1;
  pointer pTVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  Token local_30;
  
  TVar1 = state->m_shader->m_type;
  if (state->m_programParams->version == VERSION_300) {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_30,"texture");
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar3 = "texture";
      if (TVar1 == TYPE_VERTEX) {
        pcVar3 = "textureLod";
      }
      Token::Token(&local_30,pcVar3);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_30,"textureProj");
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar3 = "textureProj";
      if (TVar1 == TYPE_VERTEX) {
        pcVar3 = "textureProjLod";
      }
      Token::Token(&local_30,pcVar3);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_30,"texture");
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar3 = "texture";
      if (TVar1 == TYPE_VERTEX) {
        pcVar3 = "textureLod";
      }
      Token::Token(&local_30,pcVar3);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    default:
      goto switchD_01978f2b_default;
    }
  }
  else {
    switch(this->m_type) {
    case TYPE_TEXTURE2D:
      Token::Token(&local_30,"texture2D");
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURE2D_LOD:
      pcVar3 = "texture2D";
      if (TVar1 == TYPE_VERTEX) {
        pcVar3 = "texture2DLod";
      }
      Token::Token(&local_30,pcVar3);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ:
      Token::Token(&local_30,"texture2DProj");
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURE2D_PROJ_LOD:
      pcVar3 = "texture2DProj";
      if (TVar1 == TYPE_VERTEX) {
        pcVar3 = "texture2DProjLod";
      }
      Token::Token(&local_30,pcVar3);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURECUBE:
      Token::Token(&local_30,"textureCube");
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    case TYPE_TEXTURECUBE_LOD:
      pcVar3 = "textureCube";
      if (TVar1 == TYPE_VERTEX) {
        pcVar3 = "textureCubeLod";
      }
      Token::Token(&local_30,pcVar3);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
      sVar5 = str->m_numTokens;
      if (sVar4 == sVar5) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
        pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl
                 .super__Vector_impl_data._M_start;
        sVar5 = str->m_numTokens;
      }
      Token::operator=(pTVar2 + sVar5,&local_30);
      break;
    default:
      goto switchD_01978f2b_default;
    }
  }
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
switchD_01978f2b_default:
  local_30.m_type = LEFT_PAREN;
  pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
  sVar5 = str->m_numTokens;
  if (sVar4 == sVar5) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = str->m_numTokens;
  }
  Token::operator=(pTVar2 + sVar5,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  Token::Token(&local_30,(this->m_sampler->m_name)._M_dataplus._M_p);
  pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
  sVar5 = str->m_numTokens;
  if (sVar4 == sVar5) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = str->m_numTokens;
  }
  Token::operator=(pTVar2 + sVar5,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  local_30.m_type = COMMA;
  pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
  sVar5 = str->m_numTokens;
  if (sVar4 == sVar5) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = str->m_numTokens;
  }
  Token::operator=(pTVar2 + sVar5,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  (*this->m_coordExpr->_vptr_Expression[3])(this->m_coordExpr,state,str);
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    local_30.m_type = COMMA;
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
    sVar5 = str->m_numTokens;
    if (sVar4 == sVar5) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
      pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = str->m_numTokens;
    }
    Token::operator=(pTVar2 + sVar5,&local_30);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_30);
    (*this->m_lodBiasExpr->_vptr_Expression[3])(this->m_lodBiasExpr,state,str);
  }
  local_30.m_type = RIGHT_PAREN;
  pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar4 = (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar2 >> 4;
  sVar5 = str->m_numTokens;
  if (sVar4 == sVar5) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar4 + 0x40);
    pTVar2 = (str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar5 = str->m_numTokens;
  }
  Token::operator=(pTVar2 + sVar5,&local_30);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_30);
  return;
}

Assistant:

void TexLookup::tokenize (GeneratorState& state, TokenStream& str) const
{
	bool isVertex = state.getShader().getType() == Shader::TYPE_VERTEX;

	if (state.getProgramParameters().version == VERSION_300)
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture";										break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "textureProj";									break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "textureProjLod" : "textureProj");	break;
			case TYPE_TEXTURECUBE:			str << "texture";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureLod" : "texture");			break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}
	else
	{
		switch (m_type)
		{
			case TYPE_TEXTURE2D:			str << "texture2D";											break;
			case TYPE_TEXTURE2D_LOD:		str << (isVertex ? "texture2DLod" : "texture2D");			break;
			case TYPE_TEXTURE2D_PROJ:		str << "texture2DProj";										break;
			case TYPE_TEXTURE2D_PROJ_LOD:	str << (isVertex ? "texture2DProjLod" : "texture2DProj");	break;
			case TYPE_TEXTURECUBE:			str << "textureCube";										break;
			case TYPE_TEXTURECUBE_LOD:		str << (isVertex ? "textureCubeLod" : "textureCube");		break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	str << Token::LEFT_PAREN;
	str << m_sampler->getName();
	str << Token::COMMA;
	m_coordExpr->tokenize(state, str);

	if (m_lodBiasExpr)
	{
		str << Token::COMMA;
		m_lodBiasExpr->tokenize(state, str);
	}

	str << Token::RIGHT_PAREN;
}